

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexFilters.cpp
# Opt level: O3

void __thiscall
Ptex::v2_2::PtexWidth4Filter::buildKernelAxis
          (PtexWidth4Filter *this,int8_t *k_ureslog2,int *k_u,int *k_uw,float *ku,float u,float uw,
          int f_ureslog2)

{
  bool bVar1;
  bool bVar2;
  float fVar3;
  int iVar4;
  uint uVar5;
  byte bVar6;
  uint uVar7;
  long lVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float f_4;
  float f;
  float fVar12;
  float f_3;
  float fVar13;
  float fVar14;
  float f_2;
  float f_1;
  
  fVar3 = (float)(f_ureslog2 * -0x800000 + 0x3f800000);
  if (uw <= fVar3) {
    uw = fVar3;
  }
  bVar6 = (byte)((uint)uw >> 0x17) ^ 0x7f;
  fVar3 = (float)(1 << (bVar6 & 0x1f));
  *k_ureslog2 = bVar6;
  if ((this->super_PtexSeparableFilter)._options.lerp == false) {
    fVar12 = 0.0;
  }
  else {
    fVar12 = (uw - 1.0 / fVar3) / (1.0 / fVar3);
  }
  fVar14 = 1.0 - fVar12;
  if (0.25 <= uw) {
    if (0.5 <= uw) {
      if (1.0 <= uw) {
        *k_ureslog2 = '\0';
        *k_uw = 2;
        fVar3 = floorf(u + -0.5);
        fVar12 = ABS((u + -0.5) - fVar3);
        *k_u = (int)fVar3;
        fVar3 = 0.0;
        if (fVar12 < 1.0) {
          fVar3 = (fVar12 + fVar12 + -3.0) * fVar12 * fVar12 + 1.0;
        }
        *ku = fVar3;
        ku[1] = 1.0 - fVar3;
      }
      else {
        *k_ureslog2 = '\x01';
        fVar3 = floorf(u + -0.5);
        *k_u = (int)fVar3 * 2;
        *k_uw = 4;
        iVar4 = *k_u;
        fVar3 = 1.0 / (uw * 1.5 + 0.5);
        lVar8 = 0;
        bVar1 = true;
        do {
          bVar2 = bVar1;
          fVar9 = (float)(int)lVar8 + ((float)iVar4 - (u + u + -0.5));
          fVar11 = ABS(fVar3 * fVar9);
          fVar10 = 0.0;
          fVar13 = 0.0;
          if (fVar11 < 1.0) {
            fVar13 = (fVar11 + fVar11 + -3.0) * fVar11 * fVar11 + 1.0;
          }
          fVar11 = ABS((fVar9 + 1.0) * fVar3);
          if (fVar11 < 1.0) {
            fVar10 = (fVar11 + fVar11 + -3.0) * fVar11 * fVar11 + 1.0;
          }
          fVar9 = ABS((fVar9 + fVar9 + 1.0) * 0.5 * fVar3);
          fVar11 = 0.0;
          if (fVar9 < 1.0) {
            fVar11 = (fVar9 + fVar9 + -3.0) * fVar9 * fVar9 + 1.0;
          }
          *(ulong *)(ku + lVar8) =
               CONCAT44(fVar11 * fVar12 + fVar10 * fVar14,fVar11 * fVar12 + fVar13 * fVar14);
          lVar8 = 2;
          bVar1 = false;
        } while (bVar2);
      }
    }
    else {
      *k_ureslog2 = '\x02';
      fVar13 = u * 4.0 + -0.5;
      fVar3 = ceilf(fVar13 + -2.0);
      fVar9 = ceilf(fVar13 + 2.0);
      uVar5 = (int)fVar3 & 0xfffffffe;
      uVar7 = (int)fVar9 + 1U & 0xfffffffe;
      *k_u = uVar5;
      iVar4 = uVar7 - uVar5;
      *k_uw = iVar4;
      if (iVar4 != 0 && (int)uVar5 <= (int)uVar7) {
        lVar8 = 0;
        do {
          fVar3 = (float)(int)lVar8 + ((float)(int)uVar5 - fVar13);
          fVar9 = (*this->_k)(fVar3,this->_c);
          fVar10 = (*this->_k)(fVar3 + 1.0,this->_c);
          fVar11 = ABS((fVar3 + fVar3 + 1.0) * 0.25 * (1.0 / (uw + 0.75)));
          fVar3 = 0.0;
          if (fVar11 < 1.0) {
            fVar3 = (fVar11 + fVar11 + -3.0) * fVar11 * fVar11 + 1.0;
          }
          *(ulong *)(ku + lVar8) =
               CONCAT44(fVar3 * fVar12 + fVar10 * fVar14,fVar3 * fVar12 + fVar9 * fVar14);
          lVar8 = lVar8 + 2;
        } while ((int)lVar8 < *k_uw);
      }
    }
  }
  else {
    fVar13 = u * fVar3 + -0.5;
    fVar3 = uw * fVar3;
    fVar9 = ceilf(fVar13 - (fVar3 + fVar3));
    uVar7 = (uint)fVar9;
    fVar9 = ceilf(fVar3 + fVar3 + fVar13);
    iVar4 = (int)fVar9;
    fVar9 = 1.0 / fVar3;
    if ((fVar12 != 0.0) || (NAN(fVar12))) {
      uVar7 = uVar7 & 0xfffffffe;
      uVar5 = iVar4 + 1U & 0xfffffffe;
      *k_u = uVar7;
      iVar4 = uVar5 - uVar7;
      *k_uw = iVar4;
      if (iVar4 != 0 && (int)uVar7 <= (int)uVar5) {
        lVar8 = 0;
        do {
          fVar3 = (float)(int)lVar8 * fVar9 + ((float)(int)uVar7 - fVar13) * fVar9;
          fVar10 = (*this->_k)(fVar3,this->_c);
          fVar11 = (*this->_k)(fVar9 + fVar3,this->_c);
          fVar3 = (*this->_k)((fVar3 + fVar9 + fVar3) * 0.5,this->_c);
          *(ulong *)(ku + lVar8) =
               CONCAT44(fVar3 * fVar12 + fVar11 * fVar14,fVar3 * fVar12 + fVar10 * fVar14);
          lVar8 = lVar8 + 2;
        } while ((int)lVar8 < *k_uw);
      }
    }
    else {
      *k_u = uVar7;
      *k_uw = iVar4 - uVar7;
      if (iVar4 - uVar7 != 0 && (int)uVar7 <= iVar4) {
        lVar8 = 0;
        do {
          fVar12 = (*this->_k)((float)(int)lVar8 * fVar9 + ((float)(int)uVar7 - fVar13) / fVar3,
                               this->_c);
          ku[lVar8] = fVar12;
          lVar8 = lVar8 + 1;
        } while (lVar8 < *k_uw);
      }
    }
  }
  return;
}

Assistant:

void buildKernelAxis(int8_t& k_ureslog2, int& k_u, int& k_uw, float* ku,
                         float u, float uw, int f_ureslog2)
    {
        // build 1 axis (note: "u" labels may repesent either u or v axis)

        // clamp filter width to no smaller than a texel
        uw = PtexUtils::max(uw, PtexUtils::reciprocalPow2(f_ureslog2));

        // compute desired texture res based on filter width
        k_ureslog2 = (int8_t)PtexUtils::calcResFromWidth(uw);
        int resu = 1 << k_ureslog2;
        float uwlo = 1.0f/(float)resu; // smallest filter width for this res

        // compute lerp weights (amount to blend towards next-lower res)
        float lerp2 = _options.lerp ? (uw-uwlo)/uwlo : 0;
        float lerp1 = 1.0f-lerp2;

        // adjust for large filter widths
        if (uw >= .25f) {
            if (uw < .5f) {
                k_ureslog2 = 2;
                float upix = u * 4.0f - 0.5f;
                int u1 = int(PtexUtils::ceil(upix - 2)), u2 = int(PtexUtils::ceil(upix + 2));
                u1 = u1 & ~1;       // round down to even pair
                u2 = (u2 + 1) & ~1; // round up to even pair
                k_u = u1;
                k_uw = u2-u1;
                float x1 = (float)u1-upix;
                for (int i = 0; i < k_uw; i+=2) {
                    float xa = x1 + (float)i, xb = xa + 1.0f, xc = (xa+xb)*0.25f;
                    // spread the filter gradually to approach the next-lower-res width
                    // at uw = .5, s = 1.0; at uw = 1, s = 0.8
                    float s = 1.0f/(uw + .75f);
                    float ka = _k(xa, _c), kb = _k(xb, _c), kc = blur(xc*s);
                    ku[i] = ka * lerp1 + kc * lerp2;
                    ku[i+1] = kb * lerp1 + kc * lerp2;
                }
                return;
            }
            else if (uw < 1) {
                k_ureslog2 = 1;
                float upix = u * 2.0f - 0.5f;
                k_u = int(PtexUtils::floor(u - .5f))*2;
                k_uw = 4;
                float x1 = (float)k_u-upix;
                for (int i = 0; i < k_uw; i+=2) {
                    float xa = x1 + (float)i, xb = xa + 1.0f, xc = (xa+xb)*0.5f;
                    // spread the filter gradually to approach the next-lower-res width
                    // at uw = .5, s = .8; at uw = 1, s = 0.5
                    float s = 1.0f/(uw*1.5f + .5f);
                    float ka = blur(xa*s), kb = blur(xb*s), kc = blur(xc*s);
                    ku[i] = ka * lerp1 + kc * lerp2;
                    ku[i+1] = kb * lerp1 + kc * lerp2;
                }
                return;
            }
            else {
                // use res 0 (1 texel per face) w/ no lerping
                // (future: use face-blended values for filter > 2)
                k_ureslog2 = 0;
                float upix = u - .5f;
                k_uw = 2;
                float ui = PtexUtils::floor(upix);
                k_u = int(ui);
                ku[0] = blur(upix-ui);
                ku[1] = 1-ku[0];
                return;
            }
        }

        // convert from normalized coords to pixel coords
        float upix = u * (float)resu - 0.5f;
        float uwpix = uw * (float)resu;

        // find integer pixel extent: [u,v] +/- [2*uw,2*vw]
        // (kernel width is 4 times filter width)
        float dupix = 2.0f*uwpix;
        int u1 = int(PtexUtils::ceil(upix - dupix)), u2 = int(PtexUtils::ceil(upix + dupix));

        if (lerp2) {
            // lerp kernel weights towards next-lower res
            // extend kernel width to cover even pairs
            u1 = u1 & ~1;
            u2 = (u2 + 1) & ~1;
            k_u = u1;
            k_uw = u2-u1;

            // compute kernel weights
            float step = 1.0f/uwpix, x1 = ((float)u1-upix)*(float)step;
            for (int i = 0; i < k_uw; i+=2) {
                float xa = x1 + (float)i*step, xb = xa + step, xc = (xa+xb)*0.5f;
                float ka = _k(xa, _c), kb = _k(xb, _c), kc = _k(xc, _c);
                ku[i] = ka * lerp1 + kc * lerp2;
                ku[i+1] = kb * lerp1 + kc * lerp2;
            }
        }
        else {
            k_u = u1;
            k_uw = u2-u1;
            // compute kernel weights
            float x1 = ((float)u1-upix)/uwpix, step = 1.0f/uwpix;
            for (int i = 0; i < k_uw; i++) ku[i] = _k(x1 + (float)i*step, _c);
        }
    }